

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O1

CharConv * CharConv::conv_for_type(CVmPackType *t)

{
  wchar_t wVar1;
  CharConvUCS2B *pCVar2;
  
  wVar1 = t->type_code;
  if (wVar1 < L'a') {
    if (wVar1 < L'U') {
      if (wVar1 == L'A') {
        return &s_CharConvLatin1.super_CharConv;
      }
      if (wVar1 == L'H') {
        return (CharConv *)&s_CharConvHexB;
      }
    }
    else {
      if (wVar1 == L'U') goto LAB_0027d116;
      if (wVar1 == L'W') goto LAB_0027d0ed;
    }
  }
  else if (wVar1 < L'h') {
    if (wVar1 == L'a') {
      return &s_CharConvLatin1.super_CharConv;
    }
    if (wVar1 == L'b') {
      return &s_CharConvByte.super_CharConv;
    }
  }
  else {
    if (wVar1 == L'h') {
      return (CharConv *)&s_CharConvHexL;
    }
    if (wVar1 == L'u') {
LAB_0027d116:
      return &s_CharConvUTF8.super_CharConv;
    }
    if (wVar1 == L'w') {
LAB_0027d0ed:
      pCVar2 = &s_CharConvUCS2B;
      if (t->big_endian == 0) {
        pCVar2 = (CharConvUCS2B *)&s_CharConvUCS2L;
      }
      return (CharConv *)pCVar2;
    }
  }
  return (CharConv *)0x0;
}

Assistant:

CharConv *CharConv::conv_for_type(const CVmPackType *t)
{
    switch (t->type_code)
    {
    case 'a':
    case 'A':
        return &s_CharConvLatin1;

    case 'b':
        return &s_CharConvByte;

    case 'u':
    case 'U':
        return &s_CharConvUTF8;

    case 'w':
    case 'W':
        if (t->big_endian)
            return &s_CharConvUCS2B;
        else
            return &s_CharConvUCS2L;

    case 'h':
        return &s_CharConvHexL;

    case 'H':
        return &s_CharConvHexB;

    default:
        /* it's not a string type */
        return 0;
    }
}